

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

void slang::SVInt::divide
               (SVInt *lhs,uint32_t lhsWords,SVInt *rhs,uint32_t rhsWords,SVInt *quotient,
               SVInt *remainder)

{
  undefined4 *puVar1;
  uint32_t *value;
  uint uVar2;
  SVInt *pSVar3;
  undefined8 uVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined1 *__s;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  uint32_t *value_00;
  SVInt *pSVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  uint32_t uVar18;
  long lVar19;
  ulong uVar20;
  uint *puVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  TempBuffer<unsigned_int,_128UL> scratch;
  undefined1 local_230 [512];
  ulong uVar24;
  
  uVar23 = rhsWords * 2;
  uVar13 = (ulong)uVar23;
  uVar8 = lhsWords * 2;
  uVar25 = uVar8 + rhsWords * -2;
  iVar7 = (4 - (uint)(remainder == (SVInt *)0x0)) * uVar23;
  uVar20 = (ulong)(iVar7 + uVar25 * 2 + 1);
  if (iVar7 + uVar25 * 2 < 0x80) {
    __s = local_230;
  }
  else {
    __s = (undefined1 *)operator_new__(uVar20 << 2);
  }
  uVar16 = (ulong)uVar8;
  puVar1 = (undefined4 *)(__s + uVar16 * 4);
  puVar21 = (uint *)(__s + uVar16 * 4 + 4);
  uVar22 = (ulong)uVar23;
  value = puVar1 + uVar22 + 1;
  value_00 = value + uVar16;
  if (remainder == (SVInt *)0x0) {
    value_00 = (uint32_t *)0x0;
  }
  memset(__s,0,uVar16 * 4 + 4);
  if (lhsWords != 0) {
    pSVar3 = (SVInt *)(lhs->super_SVIntStorage).field_0.val;
    pSVar12 = lhs;
    if (((lhs->super_SVIntStorage).unknownFlag & 1U) != 0) {
      pSVar12 = pSVar3;
    }
    if (0x40 < (lhs->super_SVIntStorage).bitWidth) {
      pSVar12 = pSVar3;
    }
    uVar17 = 0;
    do {
      uVar4 = *(undefined8 *)((long)&(pSVar12->super_SVIntStorage).field_0 + uVar17 * 4);
      *(int *)(__s + (uVar17 & 0xffffffff) * 4) = (int)uVar4;
      *(int *)(__s + (ulong)((int)uVar17 + 1) * 4) = (int)((ulong)uVar4 >> 0x20);
      uVar17 = uVar17 + 2;
    } while ((ulong)lhsWords * 2 != uVar17);
  }
  memset(puVar21,0,uVar22 * 4);
  if (rhsWords != 0) {
    pSVar3 = (SVInt *)(rhs->super_SVIntStorage).field_0.val;
    pSVar12 = rhs;
    if (((rhs->super_SVIntStorage).unknownFlag & 1U) != 0) {
      pSVar12 = pSVar3;
    }
    if (0x40 < (rhs->super_SVIntStorage).bitWidth) {
      pSVar12 = pSVar3;
    }
    uVar17 = 0;
    do {
      uVar4 = *(undefined8 *)((long)&(pSVar12->super_SVIntStorage).field_0 + uVar17 * 4);
      puVar21[uVar17 & 0xffffffff] = (uint)uVar4;
      puVar21[(int)uVar17 + 1] = (uint)((ulong)uVar4 >> 0x20);
      uVar17 = uVar17 + 2;
    } while ((ulong)rhsWords * 2 != uVar17);
  }
  memset(value,0,uVar16 * 4);
  if (remainder != (SVInt *)0x0) {
    memset(value_00,0,uVar22 * 4);
  }
  *puVar1 = 0;
  uVar17 = uVar22;
  if (uVar23 != 0) {
    do {
      if (puVar1[uVar17] != 0) {
        uVar25 = uVar8 - (int)uVar17;
        uVar13 = uVar17 & 0xffffffff;
        goto LAB_001aa56d;
      }
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
    uVar13 = 0;
    uVar25 = uVar8;
  }
LAB_001aa56d:
  uVar23 = uVar25;
  if (uVar8 != 0) {
    uVar8 = uVar25 + lhsWords * -2;
    uVar17 = uVar16;
    do {
      uVar23 = uVar25;
      if (*(int *)(__s + uVar17 * 4 + -4) != 0) break;
      uVar25 = uVar25 - 1;
      uVar17 = uVar17 - 1;
      uVar23 = uVar8;
    } while (uVar17 != 0);
  }
  iVar7 = (int)uVar13;
  if (iVar7 == 1) {
    iVar7 = uVar23 + 1;
    if ((int)uVar23 < 0) {
      uVar18 = 0;
    }
    else {
      uVar8 = *puVar21;
      uVar13 = (ulong)uVar8;
      puVar21 = (uint *)(__s + (ulong)uVar23 * 4);
      uVar17 = 0;
      do {
        uVar9 = uVar17 << 0x20;
        uVar23 = *puVar21;
        uVar17 = (ulong)uVar23;
        uVar9 = uVar9 | uVar17;
        if (uVar9 == 0) {
          puVar21[uVar16 + uVar22 + 1] = 0;
LAB_001aa606:
          uVar17 = 0;
        }
        else if (uVar9 < uVar13) {
          puVar21[uVar16 + uVar22 + 1] = 0;
        }
        else {
          if (uVar9 == uVar13) {
            puVar21[uVar16 + uVar22 + 1] = 1;
            goto LAB_001aa606;
          }
          uVar25 = (uint)(uVar9 / uVar13);
          puVar21[uVar16 + uVar22 + 1] = uVar25;
          uVar17 = (ulong)(uVar23 - uVar25 * uVar8);
        }
        uVar18 = (uint32_t)uVar17;
        iVar7 = iVar7 + -1;
        puVar21 = puVar21 + -1;
      } while (0 < iVar7);
    }
    if (remainder != (SVInt *)0x0) {
      *value_00 = uVar18;
    }
  }
  else {
    uVar25 = iVar7 - 1;
    uVar16 = (ulong)uVar25;
    uVar8 = puVar21[uVar16];
    if (uVar8 == 0) {
      uVar28 = 0x20;
    }
    else {
      uVar28 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uVar28 = uVar28 ^ 0x1f;
    }
    bVar11 = (byte)uVar28;
    if (uVar28 == 0) {
      uVar8 = 0;
    }
    else {
      if (uVar23 + iVar7 == 0) {
        uVar8 = 0;
      }
      else {
        uVar22 = 0;
        uVar26 = 0;
        do {
          uVar8 = *(uint *)(__s + uVar22 * 4) >> (0x20 - bVar11 & 0x1f);
          *(uint *)(__s + uVar22 * 4) = *(uint *)(__s + uVar22 * 4) << (bVar11 & 0x1f) | uVar26;
          uVar22 = uVar22 + 1;
          uVar26 = uVar8;
        } while (uVar23 + iVar7 != uVar22);
      }
      if (iVar7 != 0) {
        uVar22 = 0;
        uVar26 = 0;
        do {
          uVar2 = puVar21[uVar22];
          puVar21[uVar22] = uVar2 << (bVar11 & 0x1f) | uVar26;
          uVar22 = uVar22 + 1;
          uVar26 = uVar2 >> (0x20 - bVar11 & 0x1f);
        } while (uVar13 != uVar22);
      }
    }
    *(uint *)(__s + (ulong)(uVar23 + iVar7) * 4) = uVar8;
    uVar22 = (ulong)uVar23;
    do {
      iVar5 = (int)uVar22;
      uVar23 = iVar5 + iVar7;
      uVar24 = (ulong)uVar23;
      uVar29 = (ulong)puVar21[uVar16];
      uVar17 = CONCAT44(*(undefined4 *)(__s + uVar24 * 4),
                        *(undefined4 *)(__s + (ulong)((iVar5 + iVar7) - 1) * 4)) / uVar29;
      uVar9 = CONCAT44(*(undefined4 *)(__s + uVar24 * 4),
                       *(undefined4 *)(__s + (ulong)((iVar5 + iVar7) - 1) * 4)) % uVar29;
      if ((uVar17 == 0x100000000) ||
         (uVar14 = (ulong)*(uint *)(__s + (ulong)(uVar23 - 2) * 4) | uVar9 << 0x20, uVar10 = uVar17,
         uVar14 <= puVar21[iVar7 - 2U] * uVar17 && puVar21[iVar7 - 2U] * uVar17 - uVar14 != 0)) {
        uVar10 = uVar17 - 1;
        uVar9 = uVar9 + uVar29;
        if ((uVar9 >> 0x20 == 0) &&
           ((uVar10 == 0x100000000 ||
            (uVar9 = (ulong)*(uint *)(__s + (ulong)(uVar23 - 2) * 4) | uVar9 << 0x20,
            uVar9 <= puVar21[iVar7 - 2U] * uVar10 && puVar21[iVar7 - 2U] * uVar10 - uVar9 != 0)))) {
          uVar10 = uVar17 - 2;
        }
      }
      if (iVar7 == 0) {
        lVar27 = 0;
      }
      else {
        uVar17 = 0;
        lVar27 = 0;
        do {
          uVar23 = puVar21[uVar17];
          uVar9 = (ulong)(uint)(iVar5 + (int)uVar17);
          lVar27 = (ulong)*(uint *)(__s + uVar9 * 4) - ((uVar23 * uVar10 & 0xffffffff) + lVar27);
          *(int *)(__s + uVar9 * 4) = (int)lVar27;
          lVar27 = (uVar23 * uVar10 >> 0x20) - (lVar27 >> 0x20);
          uVar17 = uVar17 + 1;
        } while (uVar13 != uVar17);
      }
      uVar23 = *(uint *)(__s + uVar24 * 4);
      *(uint *)(__s + uVar24 * 4) = uVar23 - (int)lVar27;
      value[uVar22] = (uint32_t)uVar10;
      if ((long)(ulong)uVar23 < lVar27) {
        value[uVar22] = (uint32_t)uVar10 - 1;
        if (iVar7 == 0) {
          uVar23 = 0;
        }
        else {
          uVar17 = 0;
          uVar23 = 0;
          do {
            uVar9 = (ulong)(uint)(iVar5 + (int)uVar17);
            uVar8 = puVar21[uVar17];
            uVar26 = *(uint *)(__s + uVar9 * 4);
            uVar2 = uVar26;
            if (uVar8 < uVar26) {
              uVar2 = uVar8;
            }
            bVar15 = (byte)uVar23;
            uVar26 = uVar23 + uVar8 + uVar26;
            *(uint *)(__s + uVar9 * 4) = uVar26;
            uVar23 = 1;
            if (uVar2 <= uVar26) {
              uVar23 = (uint)(bVar15 & uVar26 == uVar2);
            }
            uVar17 = uVar17 + 1;
          } while (uVar13 != uVar17);
        }
        *(uint *)(__s + uVar24 * 4) = *(int *)(__s + uVar24 * 4) + uVar23;
      }
      bVar6 = uVar22 != 0;
      uVar22 = uVar22 - 1;
    } while (bVar6);
    if (remainder != (SVInt *)0x0) {
      if (uVar28 == 0) {
        if (-1 < (int)uVar25) {
          lVar27 = uVar16 + 1;
          do {
            value_00[lVar27 + -1] = *(uint32_t *)(__s + lVar27 * 4 + -4);
            lVar19 = lVar27 + -1;
            bVar6 = 0 < lVar27;
            lVar27 = lVar19;
          } while (lVar19 != 0 && bVar6);
        }
      }
      else if (-1 < (int)uVar25) {
        lVar27 = uVar16 + 1;
        uVar23 = 0;
        do {
          uVar8 = *(uint *)(__s + lVar27 * 4 + -4);
          value_00[lVar27 + -1] = uVar8 >> (bVar11 & 0x1f) | uVar23;
          lVar19 = lVar27 + -1;
          bVar6 = 0 < lVar27;
          lVar27 = lVar19;
          uVar23 = uVar8 << (0x20 - bVar11 & 0x1f);
        } while (lVar19 != 0 && bVar6);
      }
    }
  }
  bVar6 = (bool)((rhs->super_SVIntStorage).signFlag & (lhs->super_SVIntStorage).signFlag);
  buildDivideResult(quotient,value,(lhs->super_SVIntStorage).bitWidth,bVar6,lhsWords);
  buildDivideResult(remainder,value_00,(rhs->super_SVIntStorage).bitWidth,bVar6,rhsWords);
  if ((0x80 < uVar20) && (__s != (undefined1 *)0x0)) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

void SVInt::divide(const SVInt& lhs, uint32_t lhsWords, const SVInt& rhs, uint32_t rhsWords,
                   SVInt* quotient, SVInt* remainder) {
    SLANG_ASSERT(lhsWords >= rhsWords);

    // The Knuth algorithm requires arrays of 32-bit words (because results of operations
    // need to fit natively into 64 bits). Allocate space for the backing memory, either on
    // the stack if it's small or on the heap if it's not.
    uint32_t divisorWords = rhsWords * 2;
    uint32_t extraWords = (lhsWords * 2) - divisorWords;
    uint32_t dividendWords = divisorWords + extraWords;

    size_t totalWordsNeeded = (remainder ? 4 : 3) * divisorWords + 2 * extraWords + 1;
    TempBuffer<uint32_t, 128> scratch(totalWordsNeeded);
    uint32_t* u = scratch.get();
    uint32_t* v = u + dividendWords + 1;
    uint32_t* q = v + divisorWords;
    uint32_t* r = remainder ? q + dividendWords : nullptr;

    // Initialize the dividend and divisor
    memset(u, 0, (dividendWords + 1) * sizeof(uint32_t));
    splitWords(lhs, u, lhsWords);

    memset(v, 0, divisorWords * sizeof(uint32_t));
    splitWords(rhs, v, rhsWords);

    // Initialize quotient and remainder
    memset(q, 0, dividendWords * sizeof(uint32_t));
    if (remainder)
        memset(r, 0, divisorWords * sizeof(uint32_t));

    // extra word for spill space in Knuth algorithm
    u[dividendWords] = 0;

    // Adjust sizes for division. The Knuth algorithm will fail if there
    // are empty words in the input.
    for (uint32_t i = divisorWords; i > 0 && v[i - 1] == 0; i--) {
        divisorWords--;
        extraWords++;
    }
    for (uint32_t i = dividendWords; i > 0 && u[i - 1] == 0; i--)
        extraWords--;

    // If we're left with only a single divisor word, Knuth won't work.
    // We can use a sequence of standard 64 bit divides for this.
    dividendWords = divisorWords + extraWords;
    if (divisorWords == 1) {
        uint32_t divisor = v[0];
        uint32_t rem = 0;
        for (int i = int(dividendWords - 1); i >= 0; i--) {
            uint64_t partial_dividend = uint64_t(rem) << 32 | u[i];
            if (partial_dividend == 0) {
                q[i] = 0;
                rem = 0;
            }
            else if (partial_dividend < divisor) {
                q[i] = 0;
                rem = (uint32_t)partial_dividend;
            }
            else if (partial_dividend == divisor) {
                q[i] = 1;
                rem = 0;
            }
            else {
                q[i] = (uint32_t)(partial_dividend / divisor);
                rem = (uint32_t)(partial_dividend - (q[i] * divisor));
            }
        }
        if (r)
            r[0] = rem;
    }
    else {
        // otherwise invoke Knuth
        knuthDiv(u, v, q, r, extraWords, divisorWords);
    }

    bool bothSigned = lhs.signFlag && rhs.signFlag;
    buildDivideResult(quotient, q, lhs.bitWidth, bothSigned, lhsWords);
    buildDivideResult(remainder, r, rhs.bitWidth, bothSigned, rhsWords);
}